

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icu_util.h
# Opt level: O0

void booster::locale::impl_icu::throw_icu_error(UErrorCode err)

{
  string *s;
  runtime_error *this;
  undefined4 in_EDI;
  allocator local_35 [13];
  string local_28 [36];
  undefined4 local_4;
  
  local_4 = in_EDI;
  s = (string *)__cxa_allocate_exception(0x30);
  this = (runtime_error *)u_errorName_70(local_4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,(char *)this,local_35);
  runtime_error::runtime_error(this,s);
  __cxa_throw(s,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

inline void throw_icu_error(UErrorCode err)
    {
        throw booster::runtime_error(u_errorName(err));
    }